

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O3

int Imf_3_2::
    SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
              (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               *begin,__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                      *end,bool multipart,string *heroView)

{
  string *psVar1;
  _Base_ptr __n;
  size_t __n_00;
  int iVar2;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  const_iterator cVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  _Base_ptr *pp_Var10;
  undefined7 in_register_00000011;
  pointer __s1;
  string *psVar11;
  MultiViewChannelName *pMVar12;
  undefined8 uVar13;
  _Base_ptr *pp_Var14;
  _Self __tmp;
  MultiViewChannelName *this_00;
  int iVar15;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  layerToPart;
  string lname;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  viewsInLayers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Self __tmp_1;
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_d0;
  string local_a0;
  string local_80;
  _Base_ptr *local_60 [2];
  _Base_ptr local_50 [2];
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  if ((int)CONCAT71(in_register_00000011,multipart) == 0) {
    pMVar12 = begin->_M_current;
    iVar15 = 1;
    if (end->_M_current != pMVar12) {
      do {
        pp_Var14 = &local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
        pMVar12->part_number = 0;
        psVar1 = &pMVar12->view;
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_assign((string *)&pMVar12->internal_name);
        }
        else {
          MultiViewChannelName::getLayer_abi_cxx11_(&local_110.first,pMVar12);
          iVar2 = std::__cxx11::string::compare((char *)&local_110);
          if (iVar2 == 0) {
            __n_00 = (pMVar12->view)._M_string_length;
            if (__n_00 == heroView->_M_string_length) {
              if (__n_00 != 0) {
                __s1 = (psVar1->_M_dataplus)._M_p;
                iVar2 = bcmp(__s1,(heroView->_M_dataplus)._M_p,__n_00);
                if (iVar2 != 0) goto LAB_00196ae5;
              }
              std::__cxx11::string::_M_assign((string *)&pMVar12->internal_name);
            }
            else {
              __s1 = (psVar1->_M_dataplus)._M_p;
LAB_00196ae5:
              local_140._M_impl._0_8_ = pp_Var14;
              std::__cxx11::string::_M_construct<char*>((string *)&local_140,__s1,__s1 + __n_00);
              std::__cxx11::string::append((char *)&local_140);
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)(pMVar12->name)._M_dataplus._M_p);
              pp_Var14 = &local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar7 = puVar8 + 2;
              if ((_Base_ptr *)*puVar8 == (_Base_ptr *)plVar7) {
                local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
                local_d0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar8[3];
                local_d0._M_impl._0_8_ = pp_Var14;
              }
              else {
                local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
                local_d0._M_impl._0_8_ = (_Base_ptr *)*puVar8;
              }
              local_d0._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar8[1];
              *puVar8 = plVar7;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__cxx11::string::operator=((string *)&pMVar12->internal_name,(string *)&local_d0)
              ;
              if ((_Base_ptr *)local_d0._M_impl._0_8_ != pp_Var14) {
                operator_delete((void *)local_d0._M_impl._0_8_,
                                (ulong)((long)&(local_d0._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              p_Var6 = local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
              pp_Var14 = (_Base_ptr *)local_140._M_impl._0_8_;
              if ((_Base_ptr *)local_140._M_impl._0_8_ !=
                  &local_140._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_00196ce4;
            }
          }
          else {
            local_60[0] = local_50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_60,local_110.first._M_dataplus._M_p,
                       local_110.first._M_dataplus._M_p + local_110.first._M_string_length);
            std::__cxx11::string::append((char *)local_60);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_60,(ulong)(pMVar12->view)._M_dataplus._M_p);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_a0.field_2._M_allocated_capacity = *psVar9;
              local_a0.field_2._8_8_ = plVar7[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar9;
              local_a0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_a0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
            pp_Var10 = (_Base_ptr *)(plVar7 + 2);
            if ((_Base_ptr *)*plVar7 == pp_Var10) {
              local_140._M_impl.super__Rb_tree_header._M_header._M_parent = *pp_Var10;
              local_140._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              local_140._M_impl._0_8_ = pp_Var14;
            }
            else {
              local_140._M_impl.super__Rb_tree_header._M_header._M_parent = *pp_Var10;
              local_140._M_impl._0_8_ = (_Base_ptr *)*plVar7;
            }
            local_140._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
            *plVar7 = (long)pp_Var10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            MultiViewChannelName::getSuffix_abi_cxx11_(&local_80,pMVar12);
            p_Var6 = (_Base_ptr)0xf;
            if ((_Base_ptr *)local_140._M_impl._0_8_ != pp_Var14) {
              p_Var6 = local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
            }
            if (p_Var6 < (_Base_ptr)
                         (local_80._M_string_length +
                         local_140._M_impl.super__Rb_tree_header._M_header._0_8_)) {
              uVar13 = (_Base_ptr)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar13 = local_80.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 <
                  (_Base_ptr)
                  (local_80._M_string_length +
                  local_140._M_impl.super__Rb_tree_header._M_header._0_8_)) goto LAB_00196ad3;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_80,0,(char *)0x0,local_140._M_impl._0_8_);
            }
            else {
LAB_00196ad3:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)local_80._M_dataplus._M_p);
            }
            local_d0._M_impl._0_8_ = &local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar7 = puVar8 + 2;
            if ((_Base_ptr *)*puVar8 == (_Base_ptr *)plVar7) {
              local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
              local_d0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar8[3];
            }
            else {
              local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
              local_d0._M_impl._0_8_ = (_Base_ptr *)*puVar8;
            }
            local_d0._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar8[1];
            *puVar8 = plVar7;
            puVar8[1] = 0;
            *(undefined1 *)plVar7 = 0;
            std::__cxx11::string::operator=((string *)&pMVar12->internal_name,(string *)&local_d0);
            if ((_Base_ptr *)local_d0._M_impl._0_8_ !=
                &local_d0._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_d0._M_impl._0_8_,
                              (ulong)((long)&(local_d0._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if ((_Base_ptr *)local_140._M_impl._0_8_ != pp_Var14) {
              operator_delete((void *)local_140._M_impl._0_8_,
                              (ulong)((long)&(local_140._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            p_Var6 = local_50[0];
            pp_Var14 = local_60[0];
            if (local_60[0] != local_50) {
LAB_00196ce4:
              operator_delete(pp_Var14,(ulong)((long)&p_Var6->_M_color + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
            operator_delete(local_110.first._M_dataplus._M_p,
                            local_110.first.field_2._M_allocated_capacity + 1);
          }
        }
        pMVar12 = pMVar12 + 1;
      } while (pMVar12 != end->_M_current);
    }
  }
  else {
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d0._M_impl.super__Rb_tree_header._M_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_d0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    iVar15 = 0;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar12 = begin->_M_current;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
    if (end->_M_current == pMVar12) {
      local_140._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_140._M_impl.super__Rb_tree_header._M_header;
      local_140._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_140._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_140._M_impl.super__Rb_tree_header._M_header._M_right =
           local_140._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      do {
        this_00 = pMVar12;
        MultiViewChannelName::getLayer_abi_cxx11_(&local_110.first,this_00);
        this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&local_d0,&local_110.first);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(this,&this_00->view);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
        pMVar12 = this_00 + 1;
      } while (this_00 + 1 != end->_M_current);
      local_140._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_140._M_impl.super__Rb_tree_header._M_header;
      local_140._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_140._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      iVar15 = 0;
      local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_140._M_impl.super__Rb_tree_header._M_header._M_right =
           local_140._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_d0._M_impl.super__Rb_tree_header._M_header._M_left ==
          &local_d0._M_impl.super__Rb_tree_header) {
        pMVar12 = this_00 + 1;
      }
      else {
        iVar15 = 0;
        p_Var6 = local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_40 = begin;
        do {
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(p_Var6 + 2),heroView);
          if (cVar3._M_node != (_Base_ptr)&p_Var6[2]._M_parent) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 1),heroView);
            pmVar4 = std::
                     map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                     ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                   *)&local_140,&local_110);
            *pmVar4 = iVar15;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110.second._M_dataplus._M_p != &local_110.second.field_2) {
              operator_delete(local_110.second._M_dataplus._M_p,
                              local_110.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
              operator_delete(local_110.first._M_dataplus._M_p,
                              local_110.first.field_2._M_allocated_capacity + 1);
            }
            iVar15 = iVar15 + 1;
          }
          local_38 = p_Var6;
          for (p_Var5 = p_Var6[2]._M_right; p_Var5 != (_Rb_tree_node_base *)&p_Var6[2]._M_parent;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            __n = p_Var5[1]._M_parent;
            if ((__n != (_Base_ptr)heroView->_M_string_length) ||
               ((__n != (_Base_ptr)0x0 &&
                (iVar2 = bcmp(*(void **)(p_Var5 + 1),(heroView->_M_dataplus)._M_p,(size_t)__n),
                iVar2 != 0)))) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        (&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var6 + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var5 + 1));
              pmVar4 = std::
                       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                       ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                     *)&local_140,&local_110);
              *pmVar4 = iVar15;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.second._M_dataplus._M_p != &local_110.second.field_2) {
                operator_delete(local_110.second._M_dataplus._M_p,
                                local_110.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
                operator_delete(local_110.first._M_dataplus._M_p,
                                local_110.first.field_2._M_allocated_capacity + 1);
              }
              iVar15 = iVar15 + 1;
            }
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_38);
        } while ((_Rb_tree_header *)p_Var6 != &local_d0._M_impl.super__Rb_tree_header);
        pMVar12 = end->_M_current;
        begin = local_40;
      }
    }
    if (pMVar12 != begin->_M_current) {
      psVar11 = (string *)&begin->_M_current->internal_name;
      do {
        std::__cxx11::string::_M_assign(psVar11);
        MultiViewChannelName::getLayer_abi_cxx11_
                  (&local_a0,(MultiViewChannelName *)(psVar11 + -0x48));
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_110,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (psVar11 + -0x28));
        pmVar4 = std::
                 map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                 ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                               *)&local_140,&local_110);
        *(mapped_type *)(psVar11 + -8) = *pmVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.second._M_dataplus._M_p != &local_110.second.field_2) {
          operator_delete(local_110.second._M_dataplus._M_p,
                          local_110.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        pMVar12 = (MultiViewChannelName *)(psVar11 + 0x20);
        psVar11 = psVar11 + 0x68;
      } while (pMVar12 != end->_M_current);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
    ::~_Rb_tree(&local_140);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_d0);
  }
  return iVar15;
}

Assistant:

inline int
SplitChannels (
    const T&           begin,
    const T&           end,
    bool               multipart = true,
    const std::string& heroView  = std::string ())
{
    if (!multipart)
    {
        for (T i = begin; i != end; i++)
        {
            i->part_number = 0;

            //does this have a view name set?
            if (i->view == "") { i->internal_name = i->name; }
            else
            {

                std::string lname = i->getLayer ();

                // no layer, only non-hero views get view name in layer name

                if (lname == "")
                {
                    if (i->view == heroView) { i->internal_name = i->name; }
                    else
                    {
                        i->internal_name = i->view + "." + i->name;
                    }
                }
                else
                {
                    i->internal_name =
                        lname + "." + i->view + "." + i->getSuffix ();
                }
            }
        }
        // single part created
        return 1;
    }
    else
    {
        // step 1: extract individual layers and parts
        // for each layer, enumerate which views are active

        std::map<std::string, std::set<std::string>> viewsInLayers;
        for (T i = begin; i != end; i++)
        {
            viewsInLayers[i->getLayer ()].insert (i->view);
        }

        // step 2: assign a part number to each layer/view

        std::map<std::pair<std::string, std::string>, int> layerToPart;

        int partCount = 0;

        for (std::map<std::string, std::set<std::string>>::const_iterator
                 layer = viewsInLayers.begin ();
             layer != viewsInLayers.end ();
             layer++)
        {
            // if this layer has a heroView, insert that first
            bool layer_has_hero =
                layer->second.find (heroView) != layer->second.end ();
            if (layer_has_hero)
            {
                layerToPart[std::make_pair (layer->first, heroView)] =
                    partCount++;
            }

            // insert other layers which aren't the hero view
            for (std::set<std::string>::const_iterator view =
                     layer->second.begin ();
                 view != layer->second.end ();
                 view++)
            {
                if (*view != heroView)
                {
                    layerToPart[std::make_pair (layer->first, *view)] =
                        partCount++;
                }
            }
        }

        // step 3: update part number of each provided channel

        for (T i = begin; i != end; i++)
        {
            i->internal_name = i->name;
            i->part_number =
                layerToPart[std::make_pair (i->getLayer (), i->view)];
        }

        // return number of parts created
        return partCount;
    }
}